

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

xml_output *
valueTagDefX(xml_output *__return_storage_ptr__,QStringList *v,QString *tagName,char *s)

{
  char *pcVar1;
  long i;
  QArrayData *pQVar2;
  storage_type *psVar3;
  char16_t *pcVar4;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QAnyStringView QVar7;
  QByteArrayView QVar8;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QArrayDataPointer<QString> local_60;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  i = (v->d).size;
  if (i == 0) {
    __return_storage_ptr__->xo_type = tNothing;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_0020092d;
    (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->xo_value).d.size = 0;
    (__return_storage_ptr__->xo_text).d.size = 0;
    (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.d = (Data *)0x0;
    (__return_storage_ptr__->xo_text).d.ptr = (char16_t *)0x0;
  }
  else {
    local_60.d = (v->d).d;
    local_60.ptr = (v->d).ptr;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar6.m_data = (storage_type *)0x5;
    QVar6.m_size = (qsizetype)&local_48;
    local_60.size = i;
    QString::fromUtf8(QVar6);
    local_78 = local_48;
    pcStack_70 = pcStack_40;
    local_68 = local_38;
    QVar7.m_size = (size_t)&local_78;
    QVar7.field_0.m_data = &local_48;
    QString::arg_impl(QVar7,(int)(tagName->d).ptr,(QChar)(char16_t)(tagName->d).size);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_60,i,(QString *)&local_48);
    QList<QString>::end((QList<QString> *)&local_60);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (s == (char *)0x0) {
      psVar5 = (storage_type *)0x0;
    }
    else {
      psVar3 = (storage_type *)0xffffffffffffffff;
      do {
        psVar5 = psVar3 + 1;
        pcVar1 = s + 1 + (long)psVar3;
        psVar3 = psVar5;
      } while (*pcVar1 != '\0');
    }
    QVar8.m_data = psVar5;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    pQVar2 = local_48;
    pcVar4 = pcStack_40;
    if (pcStack_40 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_48,(QChar *)&local_60,(longlong)pcVar4);
    __return_storage_ptr__->xo_type = tValueTag;
    (__return_storage_ptr__->xo_text).d.d = (Data *)local_48;
    (__return_storage_ptr__->xo_text).d.ptr = pcStack_40;
    (__return_storage_ptr__->xo_text).d.size = local_38;
    if (local_48 == (QArrayData *)0x0) {
      (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
      (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->xo_value).d.size = 0;
    }
    else {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (__return_storage_ptr__->xo_value).d.d = (Data *)0x0;
      (__return_storage_ptr__->xo_value).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->xo_value).d.size = 0;
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_0020092d:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline XmlOutput::xml_output valueTagDefX(const QStringList &v, const QString &tagName, const char *s = " ")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(tagName));
    return valueTag(temp.join(s));
}